

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O2

IDeckLinkInputCallback *
cdecklink_internal_callback_create_deck_link_input_callback
          (void *ctx,undefined1 *cb0,cdecklink_input_callback_video_input_frame_arrived *cb1)

{
  IDeckLinkInputCallback *pIVar1;
  
  if (cb0 != (undefined1 *)0x0 || cb1 != (cdecklink_input_callback_video_input_frame_arrived *)0x0)
  {
    pIVar1 = (IDeckLinkInputCallback *)operator_new(0x28);
    (pIVar1->super_IUnknown)._vptr_IUnknown = (_func_int **)&PTR_QueryInterface_00108b30;
    *(undefined4 *)&pIVar1[1].super_IUnknown._vptr_IUnknown = 0;
    pIVar1[2].super_IUnknown._vptr_IUnknown = (_func_int **)ctx;
    pIVar1[3].super_IUnknown._vptr_IUnknown = (_func_int **)cb0;
    pIVar1[4].super_IUnknown._vptr_IUnknown = (_func_int **)cb1;
    return pIVar1;
  }
  return (IDeckLinkInputCallback *)0x0;
}

Assistant:

IDeckLinkInputCallback* cdecklink_internal_callback_create_deck_link_input_callback (void *ctx, cdecklink_input_callback_video_input_format_changed *cb0, cdecklink_input_callback_video_input_frame_arrived *cb1) {
	if (cb0 != nullptr || cb1 != nullptr) {
		return new DeckLinkInputCallback(ctx, cb0, cb1);
	}
	return nullptr;
}